

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderStorageBufferObjectTests.cpp
# Opt level: O0

long __thiscall gl4cts::anon_unknown_0::NegativeAPIBlockBinding::Run(NegativeAPIBlockBinding *this)

{
  bool bVar1;
  GLuint shader;
  GLuint program;
  GLenum GVar2;
  GLuint p;
  GLuint sh;
  char *glsl_vs;
  NegativeAPIBlockBinding *pNStack_18;
  GLint bindings;
  NegativeAPIBlockBinding *this_local;
  
  pNStack_18 = this;
  bVar1 = ShaderStorageBufferObjectBase::SupportedInVS(&this->super_ShaderStorageBufferObjectBase,1)
  ;
  if (bVar1) {
    glu::CallLogWrapper::glGetIntegerv
              (&(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,0x90dd,(GLint *)((long)&glsl_vs + 4));
    _p = "#version 430 core\nbuffer Buffer {\n  int x;\n};\nvoid main() {\n  x = 0;\n}";
    shader = glu::CallLogWrapper::glCreateShader
                       (&(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.
                         super_GLWrapper.super_CallLogWrapper,0x8b31);
    glu::CallLogWrapper::glShaderSource
              (&(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,shader,1,(GLchar **)&p,(GLint *)0x0);
    glu::CallLogWrapper::glCompileShader
              (&(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,shader);
    program = glu::CallLogWrapper::glCreateProgram
                        (&(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.
                          super_GLWrapper.super_CallLogWrapper);
    glu::CallLogWrapper::glAttachShader
              (&(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,program,shader);
    glu::CallLogWrapper::glDeleteShader
              (&(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,shader);
    glu::CallLogWrapper::glLinkProgram
              (&(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,program);
    glu::CallLogWrapper::glShaderStorageBlockBinding
              (&(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,program,0,glsl_vs._4_4_);
    GVar2 = glu::CallLogWrapper::glGetError
                      (&(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.
                        super_GLWrapper.super_CallLogWrapper);
    if (GVar2 == 0x501) {
      glu::CallLogWrapper::glShaderStorageBlockBinding
                (&(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.super_GLWrapper.
                  super_CallLogWrapper,program,1,0);
      GVar2 = glu::CallLogWrapper::glGetError
                        (&(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.
                          super_GLWrapper.super_CallLogWrapper);
      if (GVar2 == 0x501) {
        glu::CallLogWrapper::glShaderStorageBlockBinding
                  (&(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.super_GLWrapper.
                    super_CallLogWrapper,0,0,0);
        GVar2 = glu::CallLogWrapper::glGetError
                          (&(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.
                            super_GLWrapper.super_CallLogWrapper);
        if (GVar2 == 0x501) {
          glu::CallLogWrapper::glShaderStorageBlockBinding
                    (&(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.super_GLWrapper.
                      super_CallLogWrapper,shader,0,0);
          GVar2 = glu::CallLogWrapper::glGetError
                            (&(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.
                              super_GLWrapper.super_CallLogWrapper);
          if (GVar2 == 0x502) {
            glu::CallLogWrapper::glDeleteProgram
                      (&(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.
                        super_GLWrapper.super_CallLogWrapper,program);
            this_local = (NegativeAPIBlockBinding *)0x0;
          }
          else {
            anon_unknown_0::Output
                      (
                      "An INVALID_OPERATION error is generated if program is the name of a shader object.\n"
                      );
            glu::CallLogWrapper::glDeleteProgram
                      (&(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.
                        super_GLWrapper.super_CallLogWrapper,program);
            this_local = (NegativeAPIBlockBinding *)&DAT_ffffffffffffffff;
          }
        }
        else {
          anon_unknown_0::Output
                    (
                    "An INVALID_VALUE error is generated if program is not the name of either a program or shader object.\n"
                    );
          glu::CallLogWrapper::glDeleteProgram
                    (&(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.super_GLWrapper.
                      super_CallLogWrapper,program);
          this_local = (NegativeAPIBlockBinding *)&DAT_ffffffffffffffff;
        }
      }
      else {
        anon_unknown_0::Output
                  (
                  "An INVALID_VALUE error is generated if storageBlockIndex is not an\nactive shader storage block index in program.\n"
                  );
        glu::CallLogWrapper::glDeleteProgram
                  (&(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.super_GLWrapper.
                    super_CallLogWrapper,program);
        this_local = (NegativeAPIBlockBinding *)&DAT_ffffffffffffffff;
      }
    }
    else {
      anon_unknown_0::Output
                (
                "An INVALID_VALUE error is generated if storageBlockBinding is\ngreater than or equal to the value of MAX_SHADER_STORAGE_BUFFER_BINDINGS.\n"
                );
      glu::CallLogWrapper::glDeleteProgram
                (&(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.super_GLWrapper.
                  super_CallLogWrapper,program);
      this_local = (NegativeAPIBlockBinding *)&DAT_ffffffffffffffff;
    }
  }
  else {
    this_local = (NegativeAPIBlockBinding *)0x10;
  }
  return (long)this_local;
}

Assistant:

virtual long Run()
	{
		if (!SupportedInVS(1))
			return NOT_SUPPORTED;
		GLint bindings;
		glGetIntegerv(GL_MAX_SHADER_STORAGE_BUFFER_BINDINGS, &bindings);

		const char* const glsl_vs =
			"#version 430 core" NL "buffer Buffer {" NL "  int x;" NL "};" NL "void main() {" NL "  x = 0;" NL "}";
		const GLuint sh = glCreateShader(GL_VERTEX_SHADER);
		glShaderSource(sh, 1, &glsl_vs, NULL);
		glCompileShader(sh);

		const GLuint p = glCreateProgram();
		glAttachShader(p, sh);
		glDeleteShader(sh);
		glLinkProgram(p);

		glShaderStorageBlockBinding(p, 0, bindings);
		if (glGetError() != GL_INVALID_VALUE)
		{
			Output("An INVALID_VALUE error is generated if storageBlockBinding is\n"
				   "greater than or equal to the value of MAX_SHADER_STORAGE_BUFFER_BINDINGS.\n");
			glDeleteProgram(p);
			return ERROR;
		}

		glShaderStorageBlockBinding(p, 1, 0);
		if (glGetError() != GL_INVALID_VALUE)
		{
			Output("An INVALID_VALUE error is generated if storageBlockIndex is not an\n"
				   "active shader storage block index in program.\n");
			glDeleteProgram(p);
			return ERROR;
		}

		glShaderStorageBlockBinding(0, 0, 0);
		if (glGetError() != GL_INVALID_VALUE)
		{
			Output("An INVALID_VALUE error is generated if program is not the name of either a program or shader "
				   "object.\n");
			glDeleteProgram(p);
			return ERROR;
		}

		glShaderStorageBlockBinding(sh, 0, 0);
		if (glGetError() != GL_INVALID_OPERATION)
		{
			Output("An INVALID_OPERATION error is generated if program is the name of a shader object.\n");
			glDeleteProgram(p);
			return ERROR;
		}

		glDeleteProgram(p);
		return NO_ERROR;
	}